

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::CompactMemTable(DBImpl *this)

{
  Version *this_00;
  undefined1 auVar1 [8];
  long in_FS_OFFSET;
  Status s;
  VersionEdit edit;
  Slice local_f0;
  undefined1 local_e0 [24];
  undefined1 local_c8 [8];
  undefined1 local_c0 [66];
  bool local_7e;
  undefined8 local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->imm_ == (MemTable *)0x0) {
    __assert_fail("imm_ != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x223,"void leveldb::DBImpl::CompactMemTable()");
  }
  VersionEdit::VersionEdit((VersionEdit *)local_c0);
  this_00 = this->versions_->current_;
  Version::Ref(this_00);
  WriteLevel0Table((DBImpl *)local_c8,(MemTable *)this,(VersionEdit *)this->imm_,(Version *)local_c0
                  );
  Version::Unref(this_00);
  if (local_c8 == (undefined1  [8])0x0) {
    if (((this->shutting_down_)._M_base._M_i & 1U) != 0) {
      local_e0._0_8_ = "Deleting DB during memtable compaction";
      local_e0._8_8_ = (pointer)0x26;
      local_f0.data_ = "";
      local_f0.size_ = 0;
      Status::IOError((Status *)(local_e0 + 0x10),(Slice *)local_e0,&local_f0);
      auVar1 = local_c8;
      local_c8 = (undefined1  [8])local_e0._16_8_;
      local_e0._16_8_ = auVar1;
      Status::~Status((Status *)(local_e0 + 0x10));
    }
    if (local_c8 == (undefined1  [8])0x0) {
      local_7e = true;
      local_c0._40_8_ = (Comparator *)0x0;
      local_c0._32_8_ = this->logfile_number_;
      local_c0[0x41] = true;
      VersionSet::LogAndApply
                ((VersionSet *)local_e0,(VersionEdit *)this->versions_,(Mutex *)local_c0);
      auVar1 = local_c8;
      local_c8 = (undefined1  [8])local_e0._0_8_;
      local_e0._0_8_ = auVar1;
      Status::~Status((Status *)local_e0);
      if (local_c8 == (undefined1  [8])0x0) {
        MemTable::Unref(this->imm_);
        this->imm_ = (MemTable *)0x0;
        (this->has_imm_)._M_base._M_i = false;
        DeleteObsoleteFiles(this);
        goto LAB_0052f1a7;
      }
    }
  }
  RecordBackgroundError(this,(Status *)local_c8);
LAB_0052f1a7:
  Status::~Status((Status *)local_c8);
  VersionEdit::~VersionEdit((VersionEdit *)local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::CompactMemTable() {
  mutex_.AssertHeld();
  assert(imm_ != nullptr);

  // Save the contents of the memtable as a new Table
  VersionEdit edit;
  Version* base = versions_->current();
  base->Ref();
  Status s = WriteLevel0Table(imm_, &edit, base);
  base->Unref();

  if (s.ok() && shutting_down_.load(std::memory_order_acquire)) {
    s = Status::IOError("Deleting DB during memtable compaction");
  }

  // Replace immutable memtable with the generated Table
  if (s.ok()) {
    edit.SetPrevLogNumber(0);
    edit.SetLogNumber(logfile_number_);  // Earlier logs no longer needed
    s = versions_->LogAndApply(&edit, &mutex_);
  }

  if (s.ok()) {
    // Commit to the new state
    imm_->Unref();
    imm_ = nullptr;
    has_imm_.store(false, std::memory_order_release);
    DeleteObsoleteFiles();
  } else {
    RecordBackgroundError(s);
  }
}